

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

void test_flush(Byte *compr,uLong *comprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  int iVar3;
  int extraout_EAX_02;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr;
  char **ppcVar6;
  char *pcVar7;
  undefined8 *extraout_RDX;
  char *__s1;
  undefined4 uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong *puVar13;
  uLong auStack_258 [2];
  undefined1 *puStack_248;
  char *pcStack_240;
  ulong uStack_230;
  undefined4 uStack_228;
  undefined4 uStack_210;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  uLong uStack_1d0;
  char *pcStack_1c0;
  undefined1 *puStack_1b8;
  code *pcStack_1b0;
  char *pcStack_1a8;
  int iStack_1a0;
  undefined1 *puStack_190;
  undefined4 uStack_188;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  uLong uStack_148;
  ulong uStack_130;
  code *pcStack_128;
  ulong uStack_120;
  uint uStack_118;
  undefined4 uStack_100;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  uLong *puStack_b0;
  Byte *pBStack_a8;
  code *pcStack_a0;
  char *local_90;
  uint local_88;
  Byte *local_78;
  undefined4 local_70;
  uLong local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  pcStack_a0 = (code *)0x10328a;
  sVar4 = strlen(hello);
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uVar9 = 0xffffffff;
  ppcVar6 = (char **)0x70;
  pcStack_a0 = (code *)0x1032b7;
  iVar1 = deflateInit_(&local_90,0xffffffff,"1.2.11");
  if (iVar1 == 0) {
    local_90 = hello;
    local_88 = 3;
    local_70 = (undefined4)*comprLen;
    uVar9 = 3;
    pcStack_a0 = (code *)0x1032dd;
    local_78 = compr;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_0010332a;
    compr[3] = compr[3] + '\x01';
    local_88 = (int)sVar4 - 2;
    sVar4 = (size_t)local_88;
    uVar9 = 4;
    pcStack_a0 = (code *)0x1032fc;
    uVar2 = deflate();
    if (1 < uVar2) goto LAB_00103331;
    pcStack_a0 = (code *)0x10330b;
    uVar2 = deflateEnd(&local_90);
    if (uVar2 == 0) {
      *comprLen = local_68;
      return;
    }
  }
  else {
    pcStack_a0 = (code *)0x10332a;
    test_flush_cold_1();
LAB_0010332a:
    pcStack_a0 = (code *)0x103331;
    test_flush_cold_2();
LAB_00103331:
    pcStack_a0 = (code *)0x103338;
    test_flush_cold_4();
    uVar2 = extraout_EAX;
  }
  uVar12 = (ulong)uVar2;
  pcStack_a0 = test_sync;
  test_flush_cold_3();
  *extraout_RDX = 0x65676162726167;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_118 = 2;
  pcVar10 = "1.2.11";
  pcStack_128 = (code *)0x10338e;
  uStack_120 = uVar12;
  puStack_b0 = comprLen;
  pBStack_a8 = compr;
  pcStack_a0 = (code *)sVar4;
  iVar1 = inflateInit_(&uStack_120,"1.2.11",0x70);
  if (iVar1 == 0) {
    uStack_100 = SUB84(ppcVar6,0);
    pcVar10 = (char *)0x0;
    pcStack_128 = (code *)0x1033a4;
    iVar1 = inflate();
    if (iVar1 != 0) goto LAB_001033fc;
    uStack_118 = (int)uVar9 - 2;
    uVar9 = (ulong)uStack_118;
    pcStack_128 = (code *)0x1033b8;
    iVar1 = inflateSync();
    if (iVar1 != 0) goto LAB_00103403;
    pcVar10 = (char *)0x4;
    pcStack_128 = (code *)0x1033c9;
    iVar1 = inflate(&uStack_120);
    if (iVar1 != -3) goto LAB_0010340a;
    pcStack_128 = (code *)0x1033d6;
    uVar2 = inflateEnd(&uStack_120);
    if (uVar2 == 0) {
      pcStack_128 = (code *)0x1033eb;
      printf("after inflateSync(): hel%s\n",extraout_RDX);
      return;
    }
  }
  else {
    pcStack_128 = (code *)0x1033fc;
    test_sync_cold_1();
LAB_001033fc:
    pcStack_128 = (code *)0x103403;
    test_sync_cold_2();
LAB_00103403:
    pcStack_128 = (code *)0x10340a;
    test_sync_cold_3();
LAB_0010340a:
    pcStack_128 = (code *)0x10340f;
    test_sync_cold_4();
    uVar2 = extraout_EAX_00;
  }
  puVar13 = (ulong *)(ulong)uVar2;
  pcStack_128 = test_dict_deflate;
  test_sync_cold_5();
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uVar8 = 9;
  pcVar7 = (char *)0x70;
  pcStack_1b0 = (code *)0x10344d;
  uStack_130 = uVar9;
  pcStack_128 = (code *)ppcVar6;
  iVar1 = deflateInit_(&pcStack_1a8,9,"1.2.11");
  if (iVar1 == 0) {
    uVar8 = 0x104348;
    pcStack_1b0 = (code *)0x103465;
    iVar1 = deflateSetDictionary(&pcStack_1a8,"hello",6);
    if (iVar1 != 0) goto LAB_001034c3;
    dictId = uStack_148;
    uStack_188 = SUB84(pcVar10,0);
    pcStack_1a8 = hello;
    pcStack_1b0 = (code *)0x10348e;
    puStack_190 = (undefined1 *)puVar13;
    sVar4 = strlen(hello);
    iStack_1a0 = (int)sVar4 + 1;
    uVar8 = 4;
    pcStack_1b0 = (code *)0x1034a1;
    iVar1 = deflate(&pcStack_1a8);
    ppcVar6 = &pcStack_1a8;
    if (iVar1 != 1) goto LAB_001034ca;
    pcStack_1b0 = (code *)0x1034ae;
    uVar2 = deflateEnd(&pcStack_1a8);
    ppcVar6 = &pcStack_1a8;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_1b0 = (code *)0x1034c3;
    test_dict_deflate_cold_1();
LAB_001034c3:
    pcStack_1b0 = (code *)0x1034ca;
    test_dict_deflate_cold_2();
LAB_001034ca:
    pcStack_1b0 = (code *)0x1034cf;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX_01;
  }
  uVar9 = (ulong)uVar2;
  pcStack_1b0 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1,"garbage",8);
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  pcVar11 = "1.2.11";
  uStack_230 = uVar9;
  uStack_228 = uVar8;
  pcStack_1c0 = pcVar10;
  puStack_1b8 = (undefined1 *)puVar13;
  pcStack_1b0 = (code *)ppcVar6;
  iVar1 = inflateInit_(&uStack_230,"1.2.11",0x70);
  if (iVar1 == 0) {
    uStack_210 = SUB84(pcVar7,0);
    pcVar7 = "hello";
    do {
      pcVar11 = (char *)0x0;
      iVar1 = inflate(&uStack_230);
      if (iVar1 == 2) {
        if (uStack_1d0 != dictId) {
          test_dict_inflate_cold_2();
          puVar13 = &uStack_230;
          goto LAB_001035b6;
        }
        pcVar11 = "hello";
        iVar1 = inflateSetDictionary(&uStack_230,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_00103577;
    } while (iVar1 == 0);
    test_dict_inflate_cold_5();
LAB_00103577:
    iVar1 = inflateEnd(&uStack_230);
    puVar13 = &uStack_230;
    if (iVar1 == 0) {
      pcVar11 = hello;
      pcVar10 = __s1;
      iVar3 = strcmp(__s1,hello);
      iVar1 = (int)pcVar10;
      puVar13 = &uStack_230;
      if (iVar3 == 0) {
        printf("inflate with dictionary: %s\n",__s1);
        return;
      }
      goto LAB_001035c4;
    }
  }
  else {
LAB_001035b6:
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_02;
  }
  test_dict_inflate_cold_3();
LAB_001035c4:
  test_dict_inflate_cold_4();
  auStack_258[0] = 40000;
  puStack_248 = (undefined1 *)puVar13;
  pcStack_240 = pcVar7;
  pcVar10 = (char *)zlibVersion();
  if (*pcVar10 == '1') {
    pcVar10 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar10,"1.2.11");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.11",0x12b0,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr,40000);
      if (iVar1 < 2) {
        pcVar10 = "foo.gz";
      }
      else {
        pcVar10 = *(char **)(pcVar11 + 8);
      }
      test_gzio(pcVar10,uncompr,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr,40000);
      test_large_deflate(compr_00,40000,uncompr,40000);
      test_large_inflate(compr_00,40000,uncompr,40000);
      test_flush(compr_00,auStack_258);
      test_sync(compr_00,auStack_258[0],uncompr,40000);
      auStack_258[0] = 40000;
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr,40000);
      free(compr_00);
      free(uncompr);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_flush(compr, comprLen)
    Byte *compr;
    uLong *comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;
    uInt len = (uInt)strlen(hello)+1;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_DEFAULT_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;
    c_stream.avail_in = 3;
    c_stream.avail_out = (uInt)*comprLen;
    err = deflate(&c_stream, Z_FULL_FLUSH);
    CHECK_ERR(err, "deflate");

    compr[3]++; /* force an error in first compressed block */
    c_stream.avail_in = len - 3;

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        CHECK_ERR(err, "deflate");
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");

    *comprLen = c_stream.total_out;
}